

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

void CPP::WriteInitialization::addQtFlagsInitializer
               (Item *item,DomPropertyMap *properties,QString *name,int column)

{
  Node<QString,_DomProperty_*> *pNVar1;
  DomProperty **ppDVar2;
  DomProperty *pDVar3;
  long in_FS_OFFSET;
  QString local_b8;
  QStringBuilder<QString_&,_QString_&> local_a0;
  QString local_90;
  QArrayData *local_78;
  QString *pQStack_70;
  long local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (properties->d != (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::findNode<QString>
                       (properties->d,name);
    if (pNVar1 != (Node<QString,_DomProperty_*> *)0x0) {
      ppDVar2 = &pNVar1->value;
      goto LAB_001318b4;
    }
  }
  ppDVar2 = (DomProperty **)0x0;
LAB_001318b4:
  if (ppDVar2 == (DomProperty **)0x0) {
    pDVar3 = (DomProperty *)0x0;
  }
  else {
    pDVar3 = *ppDVar2;
  }
  if (pDVar3 != (DomProperty *)0x0) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QArrayData *)CONCAT62(local_78._2_6_,L'|');
    pQStack_70 = (QString *)&language::qtQualifier;
    QStringBuilder<char16_t,_QString_&>::convertTo<QString>
              (&local_58,(QStringBuilder<char16_t,_QString_&> *)&local_78);
    local_78 = &((pDVar3->m_set).d.d)->super_QArrayData;
    pQStack_70 = (QString *)(pDVar3->m_set).d.ptr;
    local_68 = (pDVar3->m_set).d.size;
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_78->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_78->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_68 != 0) {
      QString::replace((QChar)(char16_t)(QStringBuilder<char16_t,_QString_&> *)&local_78,
                       (QString *)0x7c,(CaseSensitivity)&local_58);
      local_a0.a = (QString *)&language::qtQualifier;
      local_a0.b = (QString *)&local_78;
      QStringBuilder<QString_&,_QString_&>::convertTo<QString>(&local_90,&local_a0);
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char16_t *)0x0;
      local_b8.d.size = 0;
      addInitializer(item,name,column,&local_90,&local_b8,false);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addQtFlagsInitializer(Item *item, const DomPropertyMap &properties,
                                                const QString &name, int column)
{
    if (const DomProperty *p = properties.value(name)) {
        const QString orOperator = u'|' + language::qtQualifier;
        QString v = p->elementSet();
        if (!v.isEmpty()) {
            v.replace(u'|', orOperator);
            addInitializer(item, name, column, language::qtQualifier + v);
        }
    }
}